

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O2

void __thiscall
spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::Loop>::WalkToLeaf
          (PostOrderTreeDFIterator<spvtools::opt::Loop> *this)

{
  pointer ppLVar1;
  pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
  local_28;
  
  local_28.first = this->current_;
  while (ppLVar1 = ((local_28.first)->nested_loops_).
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        ppLVar1 !=
        ((local_28.first)->nested_loops_).
        super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    local_28.second._M_current = ppLVar1 + 1;
    std::
    deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
    ::
    emplace_back<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>
              ((deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
                *)&this->parent_iterators_,&local_28);
    local_28.first =
         *(this->current_->nested_loops_).
          super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
          super__Vector_impl_data._M_start;
    this->current_ = local_28.first;
  }
  return;
}

Assistant:

inline void WalkToLeaf() {
    while (current_->begin() != current_->end()) {
      NodeIterator next = ++current_->begin();
      parent_iterators_.emplace(make_pair(current_, next));
      // Set the first child as the new node.
      current_ = *current_->begin();
    }
  }